

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plane.cpp
# Opt level: O2

void __thiscall Plane::input(Plane *this,string *var,stringstream *ss)

{
  bool bVar1;
  Vector3 *vec;
  
  bVar1 = std::operator==(var,"Dx=");
  if (bVar1) {
    vec = &this->Dx;
  }
  else {
    bVar1 = std::operator==(var,"Dy=");
    if (bVar1) {
      vec = &this->Dy;
    }
    else {
      bVar1 = std::operator==(var,"N=");
      if (!bVar1) {
        bVar1 = std::operator==(var,"R=");
        if (bVar1) {
          std::istream::_M_extract<double>((double *)ss);
        }
        else {
          Primitive::input(&this->super_Primitive,var,ss);
        }
        goto LAB_0010fcde;
      }
      vec = &this->N;
    }
  }
  operator>>(ss,vec);
LAB_0010fcde:
  (*(this->super_Primitive)._vptr_Primitive[1])(this);
  return;
}

Assistant:

void Plane::input(const std::string &var, std::stringstream &ss) {
    if (var == "Dx=") ss >> Dx;
    else if (var == "Dy=") ss >> Dy;
    else if (var == "N=") ss >> N;
    else if (var == "R=") ss >> r;
    else Primitive::input(var, ss);
    init();
}